

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyGlobals.cpp
# Opt level: O1

void __thiscall wasm::SimplifyGlobals::propagateConstantsToGlobals(SimplifyGlobals *this)

{
  Id IVar1;
  Global *pGVar2;
  Expression *curr;
  uintptr_t uVar3;
  pointer puVar4;
  pointer puVar5;
  pointer puVar6;
  bool bVar7;
  mapped_type *pmVar8;
  ulong uVar9;
  byte bVar10;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *elementSegment;
  pointer puVar11;
  pointer puVar12;
  pointer puVar13;
  pointer puVar14;
  undefined1 local_e0 [8];
  map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
  constantGlobals;
  Builder builder;
  Literal local_a0;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_88;
  pointer local_70;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_68;
  undefined1 local_50 [8];
  anon_class_16_2_ad9b0d18 applyGlobals;
  
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this->module;
  applyGlobals.constantGlobals =
       (map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
        *)&constantGlobals._M_t._M_impl.super__Rb_tree_header._M_node_count;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&constantGlobals;
  constantGlobals._M_t._M_impl._0_4_ = 0;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_50 = (undefined1  [8])local_e0;
  puVar14 = (((Module *)constantGlobals._M_t._M_impl.super__Rb_tree_header._M_node_count)->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar11 = (((Module *)constantGlobals._M_t._M_impl.super__Rb_tree_header._M_node_count)->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       constantGlobals._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  puVar6 = puVar11;
  applyGlobals.builder = (Builder *)this;
  if (puVar14 != puVar11) {
    do {
      local_70 = puVar6;
      pGVar2 = (puVar14->_M_t).
               super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
               super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar2->super_Importable).module + 8) == (char *)0x0) {
        propagateConstantsToGlobals::anon_class_16_2_ad9b0d18::operator()
                  ((anon_class_16_2_ad9b0d18 *)local_50,&pGVar2->init);
        curr = ((puVar14->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init;
        bVar7 = Properties::isSingleConstantExpression(curr);
        if (!bVar7) {
          IVar1 = curr->_id;
          if (IVar1 == TupleMakeId) {
            uVar3 = curr[1].type.id;
            puVar11 = (pointer)(ulong)(uVar3 == 0);
            if (uVar3 != 0) {
              uVar9 = 0;
              do {
                if (curr[1].type.id <= uVar9) {
                  __assert_fail("index < usedElements",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                                ,0xbc,
                                "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                               );
                }
                bVar7 = Properties::isSingleConstantExpression
                                  (*(Expression **)(*(long *)(curr + 1) + uVar9 * 8));
                if (!bVar7) break;
                uVar9 = uVar9 + 1;
                puVar11 = (pointer)(ulong)(uVar3 == uVar9);
              } while (uVar3 != uVar9);
            }
          }
          bVar10 = (byte)puVar11;
          puVar11 = local_70;
          if ((~bVar10 & 1) != 0 || IVar1 != TupleMakeId) goto LAB_00b10988;
        }
        getLiteralsFromConstExpression
                  ((Literals *)&builder,
                   ((puVar14->_M_t).
                    super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                    super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                    super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl)->init);
        pmVar8 = std::
                 map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                 ::operator[]((map<wasm::Name,_wasm::Literals,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
                               *)local_e0,
                              (key_type *)
                              (puVar14->_M_t).
                              super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>
                              .super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl);
        (pmVar8->super_SmallVector<wasm::Literal,_1UL>).usedFixed = (size_t)builder.wasm;
        Literal::operator=((pmVar8->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems,&local_a0)
        ;
        local_68.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pmVar8->super_SmallVector<wasm::Literal,_1UL>).flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_68.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             (pmVar8->super_SmallVector<wasm::Literal,_1UL>).flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_68.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pmVar8->super_SmallVector<wasm::Literal,_1UL>).flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        (pmVar8->super_SmallVector<wasm::Literal,_1UL>).flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
        (pmVar8->super_SmallVector<wasm::Literal,_1UL>).flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        (pmVar8->super_SmallVector<wasm::Literal,_1UL>).flexible.
        super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_68);
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_88);
        Literal::~Literal(&local_a0);
      }
LAB_00b10988:
      puVar14 = puVar14 + 1;
      puVar6 = local_70;
    } while (puVar14 != puVar11);
  }
  puVar12 = ((applyGlobals.builder[0xb].wasm)->elementSegments).
            super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = ((applyGlobals.builder[0xb].wasm)->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar12 != puVar4) {
    do {
      propagateConstantsToGlobals::anon_class_16_2_ad9b0d18::operator()
                ((anon_class_16_2_ad9b0d18 *)local_50,
                 &((puVar12->_M_t).
                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl)->offset);
      puVar12 = puVar12 + 1;
    } while (puVar12 != puVar4);
  }
  puVar13 = ((applyGlobals.builder[0xb].wasm)->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar5 = ((applyGlobals.builder[0xb].wasm)->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar13 != puVar5) {
    do {
      propagateConstantsToGlobals::anon_class_16_2_ad9b0d18::operator()
                ((anon_class_16_2_ad9b0d18 *)local_50,
                 &((puVar13->_M_t).
                   super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                   .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl)->offset);
      puVar13 = puVar13 + 1;
    } while (puVar13 != puVar5);
  }
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_wasm::Literals>,_std::_Select1st<std::pair<const_wasm::Name,_wasm::Literals>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Literals>_>_>
               *)local_e0);
  return;
}

Assistant:

void propagateConstantsToGlobals() {
    Builder builder(*module);

    // We will note constant globals here as we compute them.
    std::map<Name, Literals> constantGlobals;

    // Given an init expression (something like the init of a global or a
    // segment), see if it is a simple global.get of a constant that we can
    // apply.
    auto applyGlobals = [&](Expression*& init) {
      if (!init) {
        // This is the init of a passive segment, which is null.
        return;
      }
      for (auto** getp : FindAllPointers<GlobalGet>(init).list) {
        auto* get = (*getp)->cast<GlobalGet>();
        auto iter = constantGlobals.find(get->name);
        if (iter != constantGlobals.end()) {
          *getp = builder.makeConstantExpression(iter->second);
        }
      }
    };

    // Go over the list of globals first, and note their constant values as we
    // go, as well as applying them where possible.
    for (auto& global : module->globals) {
      if (!global->imported()) {
        // Apply globals to this value, which may turn it into a constant we can
        // further propagate, or it may already have been one.
        applyGlobals(global->init);
        if (Properties::isConstantExpression(global->init)) {
          constantGlobals[global->name] =
            getLiteralsFromConstExpression(global->init);
        }
      }
    }

    // Go over other things with inits and apply globals there.
    for (auto& elementSegment : module->elementSegments) {
      applyGlobals(elementSegment->offset);
    }
    for (auto& dataSegment : module->dataSegments) {
      applyGlobals(dataSegment->offset);
    }
  }